

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O3

void __thiscall PeleLM::writePlotFile(PeleLM *this,string *dir,ostream *os,How how)

{
  _Rb_tree_header *p_Var1;
  pointer pSVar2;
  pointer pcVar3;
  element_type *peVar4;
  pointer pBVar5;
  Amr *pAVar6;
  bool bVar7;
  int iVar8;
  IndexType IVar9;
  int iVar10;
  int iVar11;
  TimeCenter TVar12;
  StateDescriptor *pSVar13;
  string *psVar14;
  long lVar15;
  _List_node_base *p_Var16;
  _Node *p_Var17;
  _Rb_tree_node_base *p_Var18;
  ostream *poVar19;
  DeriveRec *pDVar20;
  _Base_ptr p_Var21;
  _Base_ptr p_Var22;
  tm *__tp;
  char *pcVar23;
  size_t sVar24;
  char *__s;
  char *__s_00;
  char *__s_01;
  char *__s_02;
  pointer pBVar25;
  int nn;
  uint uVar26;
  int k;
  long lVar27;
  int i;
  ulong uVar28;
  _List_node_base *p_Var29;
  string FullPath;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> plot_var_map;
  string LevelStr;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  derive_names;
  string TheFullPath;
  time_t now;
  ParmParse pp;
  MultiFab plotMF;
  Real local_1340;
  string local_1338;
  pair<int,_int> *local_1318;
  iterator iStack_1310;
  pair<int,_int> *local_1308;
  int local_12fc;
  Real local_12f8;
  string local_12f0;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_12d0;
  How local_12b4;
  ulong local_12b0;
  ulong local_12a8;
  _Base_ptr local_12a0;
  undefined1 local_1298 [8];
  Arena *local_1290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1288;
  pointer pbStack_1278;
  ios_base local_11a0 [264];
  time_t local_1098;
  ParmParse local_1090;
  undefined1 local_1038 [16];
  undefined1 local_1028 [8];
  double adStack_1020 [510];
  
  bVar7 = amrex::Amr::Plot_Files_Output();
  if (bVar7) {
    local_1038._0_8_ = local_1028;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1038,"ht","");
    amrex::ParmParse::ParmParse(&local_1090,(string *)local_1038);
    if ((undefined1 *)local_1038._0_8_ != local_1028) {
      operator_delete((void *)local_1038._0_8_,(long)local_1028 + 1);
    }
    local_12b4 = how;
    amrex::ParmParse::query(&local_1090,"plot_rhoydot",&plot_rhoydot,0);
    local_1318 = (pair<int,_int> *)0x0;
    iStack_1310._M_current = (pair<int,_int> *)0x0;
    local_1308 = (pair<int,_int> *)0x0;
    iVar8 = amrex::DescriptorList::size((DescriptorList *)amrex::AmrLevel::desc_lst);
    if (0 < iVar8) {
      lVar27 = 0;
      do {
        iVar11 = (int)lVar27;
        pSVar13 = amrex::DescriptorList::operator[]
                            ((DescriptorList *)amrex::AmrLevel::desc_lst,iVar11);
        iVar8 = amrex::StateDescriptor::nComp(pSVar13);
        if (0 < iVar8) {
          iVar8 = 0;
          do {
            pSVar13 = amrex::DescriptorList::operator[]
                                ((DescriptorList *)amrex::AmrLevel::desc_lst,iVar11);
            psVar14 = amrex::StateDescriptor::name_abi_cxx11_(pSVar13,iVar8);
            bVar7 = amrex::Amr::isStatePlotVar(psVar14);
            if (bVar7) {
              pSVar13 = amrex::DescriptorList::operator[]
                                  ((DescriptorList *)amrex::AmrLevel::desc_lst,iVar11);
              IVar9 = amrex::StateDescriptor::getType(pSVar13);
              if (IVar9.itype == 0) {
                lVar15 = std::__cxx11::string::find((char *)psVar14,0x661974,0);
                if (lVar15 == -1) {
                  local_1038._4_4_ = iVar8;
                  local_1038._0_4_ = iVar11;
                  if (iStack_1310._M_current == local_1308) {
                    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                    _M_realloc_insert<std::pair<int,int>>
                              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                               &local_1318,iStack_1310,(pair<int,_int> *)local_1038);
                  }
                  else {
LAB_001c96d1:
                    local_1038._4_4_ = iVar8;
                    local_1038._0_4_ = iVar11;
                    (iStack_1310._M_current)->first = iVar11;
                    (iStack_1310._M_current)->second = iVar8;
                    iStack_1310._M_current = iStack_1310._M_current + 1;
                  }
                }
                else if (plot_rhoydot == true) {
                  local_1038._4_4_ = iVar8;
                  local_1038._0_4_ = iVar11;
                  if (iStack_1310._M_current != local_1308) goto LAB_001c96d1;
                  std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                  _M_realloc_insert<std::pair<int,int>>
                            ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                             &local_1318,iStack_1310,(pair<int,_int> *)local_1038);
                }
              }
            }
            iVar8 = iVar8 + 1;
            pSVar13 = amrex::DescriptorList::operator[]
                                ((DescriptorList *)amrex::AmrLevel::desc_lst,iVar11);
            iVar10 = amrex::StateDescriptor::nComp(pSVar13);
          } while (iVar8 < iVar10);
        }
        lVar27 = lVar27 + 1;
        iVar8 = amrex::DescriptorList::size((DescriptorList *)amrex::AmrLevel::desc_lst);
      } while (lVar27 < iVar8);
    }
    local_12d0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_12d0;
    local_12d0._M_impl._M_node._M_size = 0;
    local_12d0._M_impl._M_node.super__List_node_base._M_prev =
         local_12d0._M_impl._M_node.super__List_node_base._M_next;
    p_Var16 = (_List_node_base *)
              amrex::DeriveList::dlist_abi_cxx11_((DeriveList *)&amrex::AmrLevel::derive_lst);
    p_Var29 = p_Var16->_M_next;
    iVar8 = 0;
    if (p_Var29 != p_Var16) {
      iVar8 = 0;
      do {
        pDVar20 = (DeriveRec *)(p_Var29 + 1);
        psVar14 = amrex::DeriveRec::name_abi_cxx11_(pDVar20);
        bVar7 = amrex::Amr::isDerivePlotVar(psVar14);
        if (bVar7) {
          psVar14 = amrex::DeriveRec::name_abi_cxx11_(pDVar20);
          p_Var17 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    _M_create_node<std::__cxx11::string_const&>
                              ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_12d0,psVar14);
          std::__detail::_List_node_base::_M_hook(&p_Var17->super__List_node_base);
          local_12d0._M_impl._M_node._M_size = local_12d0._M_impl._M_node._M_size + 1;
          iVar11 = amrex::DeriveRec::numDerive(pDVar20);
          iVar8 = iVar8 + iVar11;
        }
        p_Var29 = (((_List_base<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_> *)
                   &p_Var29->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      } while (p_Var29 != p_Var16);
    }
    p_Var18 = (this->auxDiag)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->auxDiag)._M_t._M_impl.super__Rb_tree_header;
    iVar11 = 0;
    if ((_Rb_tree_header *)p_Var18 != p_Var1) {
      iVar11 = 0;
      do {
        iVar11 = iVar11 + *(int *)(*(long *)(p_Var18 + 2) + 0xcc);
        p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
      } while ((_Rb_tree_header *)p_Var18 != p_Var1);
    }
    local_12a8 = (ulong)(uint)(iVar11 + iVar8);
    local_12b0 = (ulong)((long)iStack_1310._M_current - (long)local_1318) >> 3;
    pSVar2 = (this->super_NavierStokesBase).super_AmrLevel.state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_12a0 = &p_Var1->_M_header;
    TVar12 = amrex::StateDescriptor::timeType(pSVar2->desc);
    if (TVar12 == Point) {
      local_12f8 = (pSVar2->new_time).stop;
    }
    else {
      local_12f8 = ((pSVar2->new_time).start + (pSVar2->new_time).stop) * 0.5;
    }
    local_12fc = (int)local_12a8 + (int)local_12b0 + 1;
    if (((this->super_NavierStokesBase).super_AmrLevel.level == 0) &&
       (*(int *)(amrex::ParallelContext::frames + 0xc) == 0)) {
      (*(this->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel[3])(local_1038);
      poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                          (os,(char *)local_1038._0_8_,local_1038._8_8_);
      local_1298[0] = (ostream)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_1298,1);
      if ((undefined1 *)local_1038._0_8_ != local_1028) {
        operator_delete((void *)local_1038._0_8_,(long)local_1028 + 1);
      }
      if (local_12fc == 0) {
        amrex::Error_host("Must specify at least one valid data item to plot");
      }
      poVar19 = (ostream *)std::ostream::operator<<(os,local_12fc);
      local_1038[0] = (string)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_1038,1);
      if (iStack_1310._M_current != local_1318) {
        uVar28 = 0;
        do {
          iVar8 = local_1318[uVar28].second;
          pSVar13 = amrex::DescriptorList::operator[]
                              ((DescriptorList *)amrex::AmrLevel::desc_lst,local_1318[uVar28].first)
          ;
          psVar14 = amrex::StateDescriptor::name_abi_cxx11_(pSVar13,iVar8);
          poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                              (os,(psVar14->_M_dataplus)._M_p,psVar14->_M_string_length);
          local_1038[0] = (string)0xa;
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_1038,1);
          uVar28 = uVar28 + 1;
        } while (uVar28 < (ulong)((long)iStack_1310._M_current - (long)local_1318 >> 3));
      }
      if (local_12d0._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_12d0
         ) {
        p_Var29 = local_12d0._M_impl._M_node.super__List_node_base._M_next;
        do {
          pDVar20 = amrex::DeriveList::get
                              ((DeriveList *)&amrex::AmrLevel::derive_lst,(string *)(p_Var29 + 1));
          iVar8 = amrex::DeriveRec::numDerive(pDVar20);
          if (0 < iVar8) {
            iVar8 = 0;
            do {
              psVar14 = amrex::DeriveRec::variableName_abi_cxx11_(pDVar20,iVar8);
              poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                                  (os,(psVar14->_M_dataplus)._M_p,psVar14->_M_string_length);
              local_1038[0] = (string)0xa;
              std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_1038,1);
              iVar8 = iVar8 + 1;
              iVar11 = amrex::DeriveRec::numDerive(pDVar20);
            } while (iVar8 < iVar11);
          }
          p_Var29 = p_Var29->_M_next;
        } while (p_Var29 != (_List_node_base *)&local_12d0);
      }
      if ((_Rb_tree_header *)
          auxDiag_names_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
          &auxDiag_names_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        p_Var22 = auxDiag_names_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          p_Var21 = *(_Base_ptr *)(p_Var22 + 2);
          if (p_Var22[2]._M_parent != p_Var21 && -1 < (long)p_Var22[2]._M_parent - (long)p_Var21) {
            lVar15 = 8;
            lVar27 = 0;
            do {
              poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                                  (os,*(char **)((long)p_Var21 + lVar15 + -8),
                                   *(long *)((long)&p_Var21->_M_color + lVar15));
              local_1038[0] = (string)0xa;
              std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_1038,1);
              lVar27 = lVar27 + 1;
              p_Var21 = *(_Base_ptr *)(p_Var22 + 2);
              lVar15 = lVar15 + 0x20;
            } while (lVar27 < (long)p_Var22[2]._M_parent - (long)p_Var21 >> 5);
          }
          p_Var22 = (_Base_ptr)std::_Rb_tree_increment(p_Var22);
        } while ((_Rb_tree_header *)p_Var22 !=
                 &auxDiag_names_abi_cxx11_._M_t._M_impl.super__Rb_tree_header);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"volFrac\n",8);
      poVar19 = (ostream *)std::ostream::operator<<(os,3);
      local_1038[0] = (string)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_1038,1);
      poVar19 = std::ostream::_M_insert<double>
                          (((this->super_NavierStokesBase).super_AmrLevel.parent)->cumtime);
      local_1038[0] = (string)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_1038,1);
      uVar26 = *(uint *)&(((this->super_NavierStokesBase).super_AmrLevel.parent)->super_AmrCore).
                         super_AmrMesh.super_AmrInfo.field_0x8c;
      uVar28 = (ulong)uVar26;
      poVar19 = (ostream *)std::ostream::operator<<(os,uVar26);
      local_1038[0] = (string)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_1038,1);
      lVar27 = 0;
      do {
        poVar19 = std::ostream::_M_insert<double>
                            ((this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xlo
                             [lVar27]);
        local_1038[0] = (string)0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_1038,1);
        lVar27 = lVar27 + 1;
      } while (lVar27 != 3);
      local_1038[0] = (string)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(os,local_1038,1);
      lVar27 = 0;
      do {
        poVar19 = std::ostream::_M_insert<double>
                            ((this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xhi
                             [lVar27]);
        local_1038[0] = (string)0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_1038,1);
        lVar27 = lVar27 + 1;
      } while (lVar27 != 3);
      local_1038[0] = (string)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(os,local_1038,1);
      if (0 < (int)uVar26) {
        lVar27 = 0;
        do {
          poVar19 = (ostream *)
                    std::ostream::operator<<
                              (os,*(int *)((long)((((this->super_NavierStokesBase).super_AmrLevel.
                                                   parent)->super_AmrCore).super_AmrMesh.
                                                  super_AmrInfo.ref_ratio.
                                                  super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                  .
                                                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->vect +
                                          lVar27));
          local_1038[0] = (string)0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_1038,1);
          lVar27 = lVar27 + 0xc;
        } while (uVar28 * 0xc != lVar27);
      }
      local_1038[0] = (string)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(os,local_1038,1);
      if (-1 < (int)uVar26) {
        lVar27 = 0;
        do {
          poVar19 = amrex::operator<<(os,(Box *)((long)(((((this->super_NavierStokesBase).
                                                           super_AmrLevel.parent)->super_AmrCore).
                                                         super_AmrMesh.geom.
                                                                                                                  
                                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                                  .
                                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->domain
                                                  ).smallend.vect + lVar27));
          local_1038[0] = (string)0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_1038,1);
          lVar27 = lVar27 + 200;
        } while (uVar28 * 200 + 200 != lVar27);
      }
      local_1038[0] = (string)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(os,local_1038,1);
      if (-1 < (int)uVar26) {
        lVar27 = 0;
        do {
          poVar19 = (ostream *)
                    std::ostream::operator<<
                              (os,(((this->super_NavierStokesBase).super_AmrLevel.parent)->
                                  level_steps).super_vector<int,_std::allocator<int>_>.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[lVar27]);
          local_1038[0] = (string)0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_1038,1);
          lVar27 = lVar27 + 1;
        } while (uVar28 + 1 != lVar27);
      }
      local_1038[0] = (string)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(os,local_1038,1);
      if (-1 < (int)uVar26) {
        lVar27 = 0x20;
        uVar28 = 0;
        do {
          lVar15 = 0;
          do {
            poVar19 = std::ostream::_M_insert<double>
                                (*(double *)
                                  ((long)(((((this->super_NavierStokesBase).super_AmrLevel.parent)->
                                           super_AmrCore).super_AmrMesh.geom.
                                           super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                           .
                                           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super_CoordSys).offset + lVar15 * 8 + lVar27 + -8));
            local_1038[0] = (string)0x20;
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_1038,1);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          local_1038[0] = (string)0xa;
          std::__ostream_insert<char,std::char_traits<char>>(os,local_1038,1);
          uVar28 = uVar28 + 1;
          lVar27 = lVar27 + 200;
        } while (uVar28 != uVar26 + 1);
      }
      poVar19 = (ostream *)
                std::ostream::operator<<
                          (os,(this->super_NavierStokesBase).super_AmrLevel.geom.super_CoordSys.
                              c_sys);
      local_1038[0] = (string)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_1038,1);
      std::__ostream_insert<char,std::char_traits<char>>(os,"0\n",2);
      std::ofstream::ofstream(local_1298);
      local_12f0._M_dataplus._M_p = (pointer)&local_12f0.field_2;
      pcVar3 = (dir->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_12f0,pcVar3,pcVar3 + dir->_M_string_length);
      local_1338._M_dataplus._M_p = (pointer)&local_1338.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1338,
                 "===============================================================================\n"
                 ,"");
      std::__cxx11::string::append((char *)&local_12f0);
      std::ofstream::open(local_1298,(_Ios_Openmode)local_12f0._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1298,local_1338._M_dataplus._M_p,local_1338._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1298," Job Information\n",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1298,local_1338._M_dataplus._M_p,local_1338._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1298,"number of MPI processes: ",0x19);
      poVar19 = (ostream *)
                std::ostream::operator<<(local_1298,*(int *)(amrex::ParallelContext::frames + 0x10))
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,"\n\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1298,local_1338._M_dataplus._M_p,local_1338._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1298," Plotfile Information\n",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1298,local_1338._M_dataplus._M_p,local_1338._M_string_length);
      local_1098 = ::time((time_t *)0x0);
      __tp = localtime(&local_1098);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1298,"output data / time: ",0x14);
      pcVar23 = asctime(__tp);
      if (pcVar23 == (char *)0x0) {
        std::ios::clear((int)&stack0xffffffffffffeca8 +
                        (int)*(undefined8 *)((long)local_1298 + -0x18) + 0xc0);
      }
      else {
        sVar24 = strlen(pcVar23);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,pcVar23,sVar24);
      }
      pcVar23 = getcwd(local_1038,0x1000);
      if (pcVar23 != (char *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1298,"output dir:         ",0x14);
        sVar24 = strlen(local_1038);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,local_1038,sVar24);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,"\n",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,"\n\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1298,local_1338._M_dataplus._M_p,local_1338._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1298," Build Information\n",0x13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1298,local_1338._M_dataplus._M_p,local_1338._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1298,"build date:    ",0xf);
      pcVar23 = amrex::buildInfoGetBuildDate();
      if (pcVar23 == (char *)0x0) {
        std::ios::clear((int)&stack0xffffffffffffeca8 +
                        (int)*(undefined8 *)((long)local_1298 + -0x18) + 0xc0);
      }
      else {
        sVar24 = strlen(pcVar23);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,pcVar23,sVar24);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1298,"build machine: ",0xf);
      pcVar23 = amrex::buildInfoGetBuildMachine();
      if (pcVar23 == (char *)0x0) {
        std::ios::clear((int)&stack0xffffffffffffeca8 +
                        (int)*(undefined8 *)((long)local_1298 + -0x18) + 0xc0);
      }
      else {
        sVar24 = strlen(pcVar23);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,pcVar23,sVar24);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1298,"build dir:     ",0xf);
      pcVar23 = amrex::buildInfoGetBuildDir();
      if (pcVar23 == (char *)0x0) {
        std::ios::clear((int)&stack0xffffffffffffeca8 +
                        (int)*(undefined8 *)((long)local_1298 + -0x18) + 0xc0);
      }
      else {
        sVar24 = strlen(pcVar23);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,pcVar23,sVar24);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1298,"BoxLib dir:    ",0xf);
      pcVar23 = amrex::buildInfoGetAMReXDir();
      if (pcVar23 == (char *)0x0) {
        std::ios::clear((int)&stack0xffffffffffffeca8 +
                        (int)*(undefined8 *)((long)local_1298 + -0x18) + 0xc0);
      }
      else {
        sVar24 = strlen(pcVar23);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,pcVar23,sVar24);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1298,"COMP:          ",0xf);
      pcVar23 = amrex::buildInfoGetComp();
      if (pcVar23 == (char *)0x0) {
        std::ios::clear((int)&stack0xffffffffffffeca8 +
                        (int)*(undefined8 *)((long)local_1298 + -0x18) + 0xc0);
      }
      else {
        sVar24 = strlen(pcVar23);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,pcVar23,sVar24);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1298,"COMP version:  ",0xf);
      pcVar23 = amrex::buildInfoGetCompVersion();
      if (pcVar23 == (char *)0x0) {
        std::ios::clear((int)&stack0xffffffffffffeca8 +
                        (int)*(undefined8 *)((long)local_1298 + -0x18) + 0xc0);
      }
      else {
        sVar24 = strlen(pcVar23);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,pcVar23,sVar24);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1298,"FCOMP:         ",0xf);
      pcVar23 = amrex::buildInfoGetFcomp();
      if (pcVar23 == (char *)0x0) {
        std::ios::clear((int)&stack0xffffffffffffeca8 +
                        (int)*(undefined8 *)((long)local_1298 + -0x18) + 0xc0);
      }
      else {
        sVar24 = strlen(pcVar23);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,pcVar23,sVar24);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1298,"FCOMP version: ",0xf);
      pcVar23 = amrex::buildInfoGetFcompVersion();
      if (pcVar23 == (char *)0x0) {
        std::ios::clear((int)&stack0xffffffffffffeca8 +
                        (int)*(undefined8 *)((long)local_1298 + -0x18) + 0xc0);
      }
      else {
        sVar24 = strlen(pcVar23);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,pcVar23,sVar24);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,"\n",1);
      for (iVar8 = 1; iVar11 = amrex::buildInfoGetNumModules(), iVar8 <= iVar11; iVar8 = iVar8 + 1)
      {
        pcVar23 = amrex::buildInfoGetModuleName(iVar8);
        if (pcVar23 == (char *)0x0) {
          std::ios::clear((int)&stack0xffffffffffffeca8 +
                          (int)*(undefined8 *)((long)local_1298 + -0x18) + 0xc0);
        }
        else {
          sVar24 = strlen(pcVar23);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,pcVar23,sVar24);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,": ",2);
        pcVar23 = amrex::buildInfoGetModuleVal(iVar8);
        if (pcVar23 == (char *)0x0) {
          std::ios::clear((int)&stack0xffffffffffffeca8 +
                          (int)*(undefined8 *)((long)local_1298 + -0x18) + 0xc0);
        }
        else {
          sVar24 = strlen(pcVar23);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,pcVar23,sVar24);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,"\n",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,"\n",1);
      pcVar23 = amrex::buildInfoGetGitHash(1);
      __s = amrex::buildInfoGetGitHash(2);
      __s_00 = amrex::buildInfoGetGitHash(3);
      __s_01 = amrex::buildInfoGetGitHash(4);
      __s_02 = amrex::buildInfoGetGitHash(5);
      if (*pcVar23 != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1298,"PeleLM git hash: ",0x11);
        sVar24 = strlen(pcVar23);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,pcVar23,sVar24);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,"\n",1);
      }
      if (*__s != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1298,"AMReX git hash: ",0x10);
        sVar24 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,__s,sVar24);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,"\n",1);
      }
      if (*__s_00 != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1298,"IAMR   git hash: ",0x11);
        sVar24 = strlen(__s_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,__s_00,sVar24);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,"\n",1);
      }
      if (*__s_01 != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1298,"AMReX-Hydro git hash: ",0x16);
        sVar24 = strlen(__s_01);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,__s_01,sVar24);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,"\n",1);
        if (*__s_01 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1298,"PelePhysics git hash: ",0x16);
          if (__s_02 == (char *)0x0) {
            std::ios::clear((int)&stack0xffffffffffffeca8 +
                            (int)*(undefined8 *)((long)local_1298 + -0x18) + 0xc0);
          }
          else {
            sVar24 = strlen(__s_02);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,__s_02,sVar24);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,"\n",1);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1298,"\n\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1298,local_1338._M_dataplus._M_p,local_1338._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1298," Inputs File Parameters\n",0x18);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1298,local_1338._M_dataplus._M_p,local_1338._M_string_length);
      amrex::ParmParse::dumpTable((ostream *)local_1298,true);
      std::ofstream::close();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1338._M_dataplus._M_p != &local_1338.field_2) {
        operator_delete(local_1338._M_dataplus._M_p,local_1338.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_12f0._M_dataplus._M_p != &local_12f0.field_2) {
        operator_delete(local_12f0._M_dataplus._M_p,local_12f0.field_2._M_allocated_capacity + 1);
      }
      local_1298 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_1298 + *(long *)(_VTT + -0x18)) = __M_insert<void_const*>;
      std::filebuf::~filebuf((filebuf *)&local_1290);
      std::ios_base::~ios_base(local_11a0);
    }
    if ((writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
         BaseName_abi_cxx11_ == '\0') &&
       (iVar8 = __cxa_guard_acquire(&writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)
                                     ::BaseName_abi_cxx11_), iVar8 != 0)) {
      writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
      BaseName_abi_cxx11_._M_dataplus._M_p =
           (pointer)&writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
                     BaseName_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
                  BaseName_abi_cxx11_,"/Cell","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
                    BaseName_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)
                           ::BaseName_abi_cxx11_);
    }
    local_1038._0_8_ = local_1028;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1038,"Level_","");
    amrex::Concatenate(&local_12f0,(string *)local_1038,
                       (this->super_NavierStokesBase).super_AmrLevel.level,1);
    if ((undefined1 *)local_1038._0_8_ != local_1028) {
      operator_delete((void *)local_1038._0_8_,(long)local_1028 + 1);
    }
    local_1338._M_dataplus._M_p = (pointer)&local_1338.field_2;
    pcVar3 = (dir->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1338,pcVar3,pcVar3 + dir->_M_string_length);
    if ((local_1338._M_string_length != 0) &&
       (local_1338._M_dataplus._M_p[local_1338._M_string_length - 1] != '/')) {
      std::__cxx11::string::push_back((char)&local_1338);
    }
    std::__cxx11::string::_M_append((char *)&local_1338,(ulong)local_12f0._M_dataplus._M_p);
    if ((*(int *)(amrex::ParallelContext::frames + 0xc) == 0) &&
       (bVar7 = amrex::UtilCreateDirectory((amrex *)&local_1338,(string *)0x1ed,0,true), !bVar7)) {
      amrex::CreateDirectoryFailed(&local_1338);
    }
    amrex::ParallelDescriptor::Barrier((string *)amrex::ParallelDescriptor::Unnamed_abi_cxx11_);
    if (*(int *)(amrex::ParallelContext::frames + 0xc) == 0) {
      poVar19 = (ostream *)
                std::ostream::operator<<(os,(this->super_NavierStokesBase).super_AmrLevel.level);
      local_1038[0] = (string)0x20;
      poVar19 = std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_1038,1);
      poVar19 = std::ostream::_M_insert<long>((long)poVar19);
      local_1038[0] = (string)0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_1038,1);
      poVar19 = std::ostream::_M_insert<double>(local_12f8);
      local_1038[0] = (string)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_1038,1);
      poVar19 = (ostream *)
                std::ostream::operator<<
                          (os,(((this->super_NavierStokesBase).super_AmrLevel.parent)->level_steps).
                              super_vector<int,_std::allocator<int>_>.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start
                              [(this->super_NavierStokesBase).super_AmrLevel.level]);
      local_1038[0] = (string)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_1038,1);
      peVar4 = (this->super_NavierStokesBase).super_AmrLevel.grids.m_ref.
               super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pBVar25 = (peVar4->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start;
      pBVar5 = (peVar4->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pBVar5 != pBVar25 && -1 < (long)pBVar5 - (long)pBVar25) {
        lVar27 = 0;
        do {
          amrex::BATransformer::operator()
                    ((Box *)local_1298,&(this->super_NavierStokesBase).super_AmrLevel.grids.m_bat,
                     pBVar25 + (int)lVar27);
          amrex::RealBox::RealBox
                    ((RealBox *)local_1038,(Box *)local_1298,
                     (this->super_NavierStokesBase).super_AmrLevel.geom.super_CoordSys.dx,
                     (this->super_NavierStokesBase).super_AmrLevel.geom.prob_domain.xlo);
          lVar15 = 0;
          do {
            poVar19 = std::ostream::_M_insert<double>(*(double *)(local_1038 + lVar15 * 8));
            local_1298[0] = (ostream)0x20;
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)local_1298,1);
            poVar19 = std::ostream::_M_insert<double>(adStack_1020[lVar15]);
            local_1298[0] = (ostream)0xa;
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)local_1298,1);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          lVar27 = lVar27 + 1;
          peVar4 = (this->super_NavierStokesBase).super_AmrLevel.grids.m_ref.
                   super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          pBVar25 = (peVar4->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar15 = (long)(peVar4->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pBVar25 >> 2;
        } while (SBORROW8(lVar27,lVar15 * 0x6db6db6db6db6db7) !=
                 lVar27 + lVar15 * -0x6db6db6db6db6db7 < 0);
      }
      if (-1 < (int)local_12a8 + (int)local_12b0) {
        local_1038._0_8_ = local_1028;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1038,local_12f0._M_dataplus._M_p,
                   local_12f0._M_dataplus._M_p + local_12f0._M_string_length);
        std::__cxx11::string::_M_append
                  (local_1038,
                   (ulong)writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)
                          ::BaseName_abi_cxx11_._M_dataplus._M_p);
        poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                            (os,(char *)local_1038._0_8_,local_1038._8_8_);
        local_1298[0] = (ostream)0xa;
        std::__ostream_insert<char,std::char_traits<char>>(poVar19,local_1298,1);
        if ((undefined1 *)local_1038._0_8_ != local_1028) {
          operator_delete((void *)local_1038._0_8_,(long)local_1028 + 1);
        }
      }
      iVar8 = (this->super_NavierStokesBase).super_AmrLevel.level;
      if (-1 < iVar8 &&
          iVar8 == *(int *)&(((this->super_NavierStokesBase).super_AmrLevel.parent)->super_AmrCore).
                            super_AmrMesh.super_AmrInfo.field_0x8c) {
        iVar8 = -1;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os,"1.0e-6\n",7);
          iVar8 = iVar8 + 1;
        } while (iVar8 < *(int *)&(((this->super_NavierStokesBase).super_AmrLevel.parent)->
                                  super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c);
      }
    }
    local_1298 = (undefined1  [8])0x1;
    local_1290 = (Arena *)0x0;
    aStack_1288._M_allocated_capacity = 0;
    aStack_1288._8_8_ = (pointer)0x0;
    pbStack_1278 = (pointer)0x0;
    uVar28 = 0;
    amrex::MultiFab::MultiFab
              ((MultiFab *)local_1038,&(this->super_NavierStokesBase).super_AmrLevel.grids,
               &(this->super_NavierStokesBase).super_AmrLevel.dmap,local_12fc,0,(MFInfo *)local_1298
               ,(this->super_NavierStokesBase).super_AmrLevel.m_factory._M_t.
                super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&aStack_1288);
    if (iStack_1310._M_current != local_1318) {
      uVar28 = 0;
      do {
        amrex::MultiFab::Copy
                  ((MultiFab *)local_1038,
                   (MultiFab *)
                   (this->super_NavierStokesBase).super_AmrLevel.state.
                   super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                   super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                   super__Vector_impl_data._M_start[local_1318[uVar28].first].new_data._M_t.
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,
                   local_1318[uVar28].second,(int)uVar28,1,0);
        uVar28 = uVar28 + 1;
      } while (uVar28 < (ulong)((long)iStack_1310._M_current - (long)local_1318 >> 3));
    }
    if ((local_12d0._M_impl._M_node._M_size != 0) &&
       (local_12d0._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_12d0))
    {
      p_Var29 = local_12d0._M_impl._M_node.super__List_node_base._M_next;
      do {
        psVar14 = (string *)(p_Var29 + 1);
        iVar8 = std::__cxx11::string::compare((char *)psVar14);
        if (((iVar8 == 0) || (iVar8 = std::__cxx11::string::compare((char *)psVar14), iVar8 == 0))
           || (iVar8 = std::__cxx11::string::compare((char *)psVar14), iVar8 == 0)) {
LAB_001cae6d:
          TVar12 = amrex::StateDescriptor::timeType
                             ((this->super_NavierStokesBase).super_AmrLevel.state.
                              super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                              super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                              ._M_impl.super__Vector_impl_data._M_start[1].desc);
          local_1340 = local_12f8;
          if (TVar12 != Interval) {
            pAVar6 = (this->super_NavierStokesBase).super_AmrLevel.parent;
            lVar27 = *(long *)((long)(pAVar6->amr_level).
                                     super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                     .
                                     super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start
                                     [*(int *)&(pAVar6->super_AmrCore).super_AmrMesh.super_AmrInfo.
                                               field_0x8c]._M_t.
                                     super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              + 0x170);
            TVar12 = amrex::StateDescriptor::timeType(*(StateDescriptor **)(lVar27 + 0xe8));
            if (TVar12 == Point) {
              local_1340 = *(Real *)(lVar27 + 400);
            }
            else {
              local_1340 = (*(double *)(lVar27 + 0x188) + *(double *)(lVar27 + 400)) * 0.5;
            }
          }
        }
        else {
          iVar8 = std::__cxx11::string::compare((char *)psVar14);
          local_1340 = local_12f8;
          if (iVar8 == 0) goto LAB_001cae6d;
        }
        pDVar20 = amrex::DeriveList::get((DeriveList *)&amrex::AmrLevel::derive_lst,psVar14);
        iVar8 = amrex::DeriveRec::numDerive(pDVar20);
        (*(this->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel[0x1f])
                  (local_1340,local_1298,this,psVar14,0);
        amrex::MultiFab::Copy((MultiFab *)local_1038,(MultiFab *)local_1298,0,(int)uVar28,iVar8,0);
        if (local_1298 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_1298 + 8))();
        }
        uVar28 = (ulong)(uint)((int)uVar28 + iVar8);
        p_Var29 = (((_List_impl *)&p_Var29->_M_next)->_M_node).super__List_node_base._M_next;
      } while (p_Var29 != (_List_node_base *)&local_12d0);
    }
    p_Var21 = local_12a0;
    p_Var22 = (this->auxDiag)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (p_Var22 == local_12a0) {
      uVar26 = (uint)uVar28;
    }
    else {
      do {
        iVar8 = ((*(MultiFab **)(p_Var22 + 2))->super_FabArray<amrex::FArrayBox>).super_FabArrayBase
                .n_comp;
        amrex::MultiFab::Copy
                  ((MultiFab *)local_1038,*(MultiFab **)(p_Var22 + 2),0,(int)uVar28,iVar8,0);
        uVar26 = iVar8 + (int)uVar28;
        p_Var22 = (_Base_ptr)std::_Rb_tree_increment(p_Var22);
        uVar28 = (ulong)uVar26;
      } while (p_Var22 != p_Var21);
    }
    local_1298 = (undefined1  [8])0x0;
    local_1290 = (Arena *)((ulong)local_1290 & 0xffffffff00000000);
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)local_1038,0.0,uVar26,1,(IntVect *)local_1298);
    amrex::MultiFab::Copy
              ((MultiFab *)local_1038,(this->super_NavierStokesBase).volfrac,0,uVar26,1,0);
    amrex::EB_set_covered((MultiFab *)local_1038,0.0);
    local_1298 = (undefined1  [8])&aStack_1288;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1298,local_1338._M_dataplus._M_p,
               local_1338._M_dataplus._M_p + local_1338._M_string_length);
    std::__cxx11::string::_M_append
              (local_1298,
               (ulong)writePlotFile(std::__cxx11::string_const&,std::ostream&,amrex::VisMF::How)::
                      BaseName_abi_cxx11_._M_dataplus._M_p);
    amrex::VisMF::Write((FabArray<amrex::FArrayBox> *)local_1038,(string *)local_1298,local_12b4,
                        false);
    if (local_1298 != (undefined1  [8])&aStack_1288) {
      operator_delete((void *)local_1298,(ulong)(aStack_1288._M_allocated_capacity + 1));
    }
    amrex::MultiFab::~MultiFab((MultiFab *)local_1038);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1338._M_dataplus._M_p != &local_1338.field_2) {
      operator_delete(local_1338._M_dataplus._M_p,local_1338.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_12f0._M_dataplus._M_p != &local_12f0.field_2) {
      operator_delete(local_12f0._M_dataplus._M_p,local_12f0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&local_12d0);
    if (local_1318 != (pair<int,_int> *)0x0) {
      operator_delete(local_1318,(long)local_1308 - (long)local_1318);
    }
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1090);
  }
  return;
}

Assistant:

void
PeleLM::writePlotFile (const std::string& dir,
                       std::ostream&  os,
                       VisMF::How     how)
{
  if ( ! Amr::Plot_Files_Output() ) return;

  ParmParse pp("ht");

  pp.query("plot_rhoydot",plot_rhoydot);
  //
  // Note that this is really the same as its NavierStokes counterpart,
  // but in order to add diagnostic MultiFabs into the plotfile, code had
  // to be interspersed within this function.
  //

  //
  // The list of indices of State to write to plotfile.
  // first component of pair is state_type,
  // second component of pair is component # within the state_type
  //
  std::vector<std::pair<int,int> > plot_var_map;
  for (long int typ = 0; typ < desc_lst.size(); typ++)
  {
    for (int comp = 0; comp < desc_lst[typ].nComp();comp++)
    {
      const std::string& name = desc_lst[typ].name(comp);

      if (parent->isStatePlotVar(name) && desc_lst[typ].getType() == IndexType::TheCellType())
      {
        //
        // When running SDC we get things of this form in the State.
        // I want a simple way not to write'm out to plotfiles.
        //
        if (name.find("I_R[") != std::string::npos)
        {
          if (plot_rhoydot)
            plot_var_map.push_back(std::pair<int,int>(typ,comp));
        }
        else
        {
          plot_var_map.push_back(std::pair<int,int>(typ,comp));
        }
      }
    }
  }

  int num_derive = 0;
  std::list<std::string> derive_names;
  const std::list<DeriveRec>& dlist = derive_lst.dlist();

  for (std::list<DeriveRec>::const_iterator it = dlist.begin(), end = dlist.end();
       it != end;
       ++it)
  {
    if (parent->isDerivePlotVar(it->name()))
    {
      derive_names.push_back(it->name());
      num_derive += it->numDerive();
    }
  }

  int num_auxDiag = 0;
  for (const auto& kv : auxDiag)
  {
    num_auxDiag += kv.second->nComp();
  }

  int n_data_items = plot_var_map.size() + num_derive + num_auxDiag;

#ifdef AMREX_USE_EB
    // add in vol frac
    n_data_items++;
#endif

  Real tnp1 = state[State_Type].curTime();

  if (level == 0 && ParallelDescriptor::IOProcessor())
  {
    //
    // The first thing we write out is the plotfile type.
    //
    os << thePlotFileType() << '\n';

    if (n_data_items == 0)
      amrex::Error("Must specify at least one valid data item to plot");

    os << n_data_items << '\n';

    //
    // Names of variables -- first state, then derived
    //
    for (long unsigned int i =0; i < plot_var_map.size(); i++)
    {
      int typ  = plot_var_map[i].first;
      int comp = plot_var_map[i].second;
      os << desc_lst[typ].name(comp) << '\n';
    }

    for (std::list<std::string>::const_iterator it = derive_names.begin(), end = derive_names.end();
         it != end;
         ++it)
    {
      const DeriveRec* rec = derive_lst.get(*it);
      for (int i = 0; i < rec->numDerive(); i++)
        os << rec->variableName(i) << '\n';
    }

    //
    // Hack in additional diagnostics.
    //
    for (std::map<std::string,Vector<std::string> >::const_iterator it = auxDiag_names.begin(), end = auxDiag_names.end();
         it != end;
         ++it)
    {
      for (long int i=0; i<it->second.size(); ++i)
        os << it->second[i] << '\n';
    }

#ifdef AMREX_USE_EB
    //add in vol frac
    os << "volFrac\n";
#endif

    os << AMREX_SPACEDIM << '\n';
    os << parent->cumTime() << '\n';
    int f_lev = parent->finestLevel();
    os << f_lev << '\n';
    for (int i = 0; i < AMREX_SPACEDIM; i++)
      os << Geom().ProbLo(i) << ' ';
    os << '\n';
    for (int i = 0; i < AMREX_SPACEDIM; i++)
      os << Geom().ProbHi(i) << ' ';
    os << '\n';
    for (int i = 0; i < f_lev; i++)
      os << parent->refRatio(i)[0] << ' ';
    os << '\n';
    for (int i = 0; i <= f_lev; i++)
      os << parent->Geom(i).Domain() << ' ';
    os << '\n';
    for (int i = 0; i <= f_lev; i++)
      os << parent->levelSteps(i) << ' ';
    os << '\n';
    for (int i = 0; i <= f_lev; i++)
    {
      for (int k = 0; k < AMREX_SPACEDIM; k++)
        os << parent->Geom(i).CellSize()[k] << ' ';
      os << '\n';
    }
    os << (int) Geom().Coord() << '\n';
    os << "0\n"; // Write bndry data.

    // job_info file with details about the run
    std::ofstream jobInfoFile;
    std::string FullPathJobInfoFile = dir;
    std::string PrettyLine = "===============================================================================\n";

    FullPathJobInfoFile += "/job_info";
    jobInfoFile.open(FullPathJobInfoFile.c_str(), std::ios::out);

    // job information
    jobInfoFile << PrettyLine;
    jobInfoFile << " Job Information\n";
    jobInfoFile << PrettyLine;

    jobInfoFile << "number of MPI processes: " << ParallelDescriptor::NProcs() << "\n";
#ifdef AMREX_USE_OMP
    jobInfoFile << "number of threads:       " << omp_get_max_threads() << "\n";
#endif
    jobInfoFile << "\n\n";

    // plotfile information
    jobInfoFile << PrettyLine;
    jobInfoFile << " Plotfile Information\n";
    jobInfoFile << PrettyLine;

    time_t now = time(0);

    // Convert now to tm struct for local timezone
    tm* localtm = localtime(&now);
    jobInfoFile   << "output data / time: " << asctime(localtm);

    char currentDir[FILENAME_MAX];
    if (getcwd(currentDir, FILENAME_MAX)) {
      jobInfoFile << "output dir:         " << currentDir << "\n";
    }

    jobInfoFile << "\n\n";


    // build information
    jobInfoFile << PrettyLine;
    jobInfoFile << " Build Information\n";
    jobInfoFile << PrettyLine;

    jobInfoFile << "build date:    " << buildInfoGetBuildDate() << "\n";
    jobInfoFile << "build machine: " << buildInfoGetBuildMachine() << "\n";
    jobInfoFile << "build dir:     " << buildInfoGetBuildDir() << "\n";
    jobInfoFile << "BoxLib dir:    " << buildInfoGetAMReXDir() << "\n";

    jobInfoFile << "\n";

    jobInfoFile << "COMP:          " << buildInfoGetComp() << "\n";
    jobInfoFile << "COMP version:  " << buildInfoGetCompVersion() << "\n";
    jobInfoFile << "FCOMP:         " << buildInfoGetFcomp() << "\n";
    jobInfoFile << "FCOMP version: " << buildInfoGetFcompVersion() << "\n";

    jobInfoFile << "\n";

    for (int nn = 1; nn <= buildInfoGetNumModules(); nn++) {
      jobInfoFile << buildInfoGetModuleName(nn) << ": " << buildInfoGetModuleVal(nn) << "\n";
    }

    jobInfoFile << "\n";

    const char* githash1 = buildInfoGetGitHash(1);
    const char* githash2 = buildInfoGetGitHash(2);
    const char* githash3 = buildInfoGetGitHash(3);
    const char* githash4 = buildInfoGetGitHash(4);
    const char* githash5 = buildInfoGetGitHash(5);
    if (strlen(githash1) > 0) {
      jobInfoFile << "PeleLM git hash: " << githash1 << "\n";
    }
    if (strlen(githash2) > 0) {
      jobInfoFile << "AMReX git hash: " << githash2 << "\n";
    }
    if (strlen(githash3) > 0) {
      jobInfoFile << "IAMR   git hash: " << githash3 << "\n";
    }
    if (strlen(githash4) > 0) {
      jobInfoFile << "AMReX-Hydro git hash: " << githash4 << "\n";
    }
    if (strlen(githash4) > 0) {
      jobInfoFile << "PelePhysics git hash: " << githash5 << "\n";
    }

    jobInfoFile << "\n\n";


    // runtime parameters
    jobInfoFile << PrettyLine;
    jobInfoFile << " Inputs File Parameters\n";
    jobInfoFile << PrettyLine;

    ParmParse::dumpTable(jobInfoFile, true);

    jobInfoFile.close();

  }
  // Build the directory to hold the MultiFab at this level.
  // The name is relative to the directory containing the Header file.
  //
  static const std::string BaseName = "/Cell";

  std::string LevelStr = amrex::Concatenate("Level_", level, 1);
  //
  // Now for the full pathname of that directory.
  //
  std::string FullPath = dir;
  if (!FullPath.empty() && FullPath[FullPath.length()-1] != '/')
    FullPath += '/';
  FullPath += LevelStr;
  //
  // Only the I/O processor makes the directory if it doesn't already exist.
  //
  if (ParallelDescriptor::IOProcessor())
    if (!amrex::UtilCreateDirectory(FullPath, 0755))
      amrex::CreateDirectoryFailed(FullPath);
  //
  // Force other processors to wait till directory is built.
  //
  ParallelDescriptor::Barrier();

  if (ParallelDescriptor::IOProcessor())
  {
    os << level << ' ' << grids.size() << ' ' << tnp1 << '\n';
    os << parent->levelSteps(level) << '\n';

    for (long int i = 0; i < grids.size(); ++i)
    {
      RealBox gridloc = RealBox(grids[i],geom.CellSize(),geom.ProbLo());
      for (int n = 0; n < AMREX_SPACEDIM; n++)
        os << gridloc.lo(n) << ' ' << gridloc.hi(n) << '\n';
    }
    //
    // The full relative pathname of the MultiFabs at this level.
    // The name is relative to the Header file containing this name.
    // It's the name that gets written into the Header.
    //
    if (n_data_items > 0)
    {
      std::string PathNameInHeader = LevelStr;
      PathNameInHeader += BaseName;
      os << PathNameInHeader << '\n';
    }

#ifdef AMREX_USE_EB
    // volfrac threshhold for amrvis
    // fixme? pulled directly from CNS, might need adjustment
        if (level == parent->finestLevel()) {
            for (int lev = 0; lev <= parent->finestLevel(); ++lev) {
                os << "1.0e-6\n";
            }
        }
#endif


  }
  //
  // We combine all of the multifabs -- state, derived, etc -- into one
  // multifab -- plotMF.
  // NOTE: we are assuming that each state variable has one component,
  // but a derived variable is allowed to have multiple components.
  int       cnt   = 0;
  int       ncomp = 1;
  const int nGrow = 0;
  //MultiFab  plotMF(grids,dmap,n_data_items,nGrow);
  MultiFab plotMF(grids,dmap,n_data_items,nGrow,MFInfo(),Factory());
  MultiFab* this_dat = 0;
  //
  // Cull data from state variables -- use no ghost cells.
  //
  for (long unsigned int i = 0; i < plot_var_map.size(); i++)
  {
    int typ  = plot_var_map[i].first;
    int comp = plot_var_map[i].second;
    this_dat = &state[typ].newData();
    MultiFab::Copy(plotMF,*this_dat,comp,cnt,ncomp,nGrow);
    cnt+= ncomp;
  }
  //
  // Cull data from derived variables.
  //
  Real plot_time;

  if (derive_names.size() > 0)
  {
    for (std::list<std::string>::const_iterator it = derive_names.begin(), end = derive_names.end();
         it != end;
         ++it)
    {
      if (*it == "avg_pressure" ||
          *it == "gradpx"       ||
          *it == "gradpy"       ||
          *it == "gradpz")
      {
        if (state[Press_Type].descriptor()->timeType() ==
            StateDescriptor::Interval)
        {
          plot_time = tnp1;
        }
        else
        {
          int f_lev = parent->finestLevel();
          plot_time = getLevel(f_lev).state[Press_Type].curTime();
        }
      }
      else
      {
        plot_time = tnp1;
      }
      const DeriveRec* rec = derive_lst.get(*it);
      ncomp = rec->numDerive();
      auto derive_dat = derive(*it,plot_time,nGrow);
      MultiFab::Copy(plotMF,*derive_dat,0,cnt,ncomp,nGrow);
      cnt += ncomp;
    }
  }


  //
  // Cull data from diagnostic multifabs.
  //
  for (const auto& kv : auxDiag)
  {
      int nComp = kv.second->nComp();
      MultiFab::Copy(plotMF,*kv.second,0,cnt,nComp,nGrow);
      cnt += nComp;
  }

#ifdef AMREX_USE_EB
    // add volume fraction to plotfile
    plotMF.setVal(0.0, cnt, 1, nGrow);
    MultiFab::Copy(plotMF,*volfrac,0,cnt,1,nGrow);

    // set covered values for ease of viewing
    EB_set_covered(plotMF, 0.0);
#endif

  //
  // Use the Full pathname when naming the MultiFab.
  //
  std::string TheFullPath = FullPath;
  TheFullPath += BaseName;

//#ifdef AMREX_USE_EB
//  bool plot_centroid_data = true;
//  pp.query("plot_centroid_data",plot_centroid_data);
//  if (plot_centroid_data) {
//    MultiFab TT(grids,dmap,plotMF.nComp(),plotMF.nGrow()+1,MFInfo(),Factory());
//    MultiFab::Copy(TT,plotMF,0,0,plotMF.nComp(),plotMF.nGrow());
//    TT.FillBoundary(geom.periodicity());
//    EB_interp_CC_to_Centroid(plotMF,TT,0,0,plotMF.nComp(),geom);
//  }
//#endif

  VisMF::Write(plotMF,TheFullPath,how);
}